

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMulsMusashi<(moira::Core)0,(moira::Instr)81,(moira::Mode)10,2>
          (Moira *this,u16 opcode)

{
  uint n;
  u32 uVar1;
  int dst;
  int src;
  u32 result;
  u32 data;
  u32 ea;
  u16 opcode_local;
  Moira *this_local;
  
  n = (int)(uint)opcode >> 9 & 7;
  data._2_2_ = opcode;
  _ea = this;
  readOp<(moira::Core)0,(moira::Mode)10,2,0ull>(this,opcode & 7,&result,(u32 *)&src);
  prefetch<(moira::Core)0,4ull>(this);
  uVar1 = readD<2>(this,n);
  uVar1 = muls<(moira::Core)0>(this,src,uVar1);
  writeD<4>(this,n,uVar1);
  return;
}

Assistant:

void
Moira::execMulsMusashi(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    readOp<C, M, Word>(src, &ea, &data);

    prefetch<C, POLL>();
    result = muls<C>(data, readD<Word>(dst));

    if constexpr (I == Instr::MULU) { SYNC_68000(50); SYNC_68010(26); }
    if constexpr (I == Instr::MULS) { SYNC_68000(50); SYNC_68010(28); }

    writeD(dst, result);
}